

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::CopyIterator
          (MapFieldBase *this,MapIterator *this_iter,MapIterator *that_iter)

{
  UntypedMapBase *pUVar1;
  undefined4 uVar2;
  CppType CVar3;
  MapKey *this_00;
  
  uVar2 = *(undefined4 *)&(that_iter->iter_).field_0x14;
  (this_iter->iter_).bucket_index_ = (that_iter->iter_).bucket_index_;
  *(undefined4 *)&(this_iter->iter_).field_0x14 = uVar2;
  pUVar1 = (that_iter->iter_).m_;
  (this_iter->iter_).node_ = (that_iter->iter_).node_;
  (this_iter->iter_).m_ = pUVar1;
  this_00 = &that_iter->key_;
  CVar3 = MapKey::type(this_00);
  (this_iter->key_).type_ = CVar3;
  (this_iter->value_).super_MapValueConstRef.type_ =
       (that_iter->value_).super_MapValueConstRef.type_;
  SetMapIteratorValue((MapFieldBase *)this_00,this_iter);
  return;
}

Assistant:

void MapFieldBase::CopyIterator(MapIterator* this_iter,
                                const MapIterator& that_iter) const {
  this_iter->iter_ = that_iter.iter_;
  this_iter->key_.SetType(that_iter.key_.type());
  // MapValueRef::type() fails when containing data is null. However, if
  // this_iter points to MapEnd, data can be null.
  this_iter->value_.SetType(
      static_cast<FieldDescriptor::CppType>(that_iter.value_.type_));
  SetMapIteratorValue(this_iter);
}